

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightParameters.hpp
# Opt level: O3

void __thiscall OpenMD::Perturbations::LightParameters::~LightParameters(LightParameters *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pdVar3;
  
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__LightParameters_002253c0;
  (this->Polarization).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00224370;
  pcVar2 = (this->Polarization).data_._M_dataplus._M_p;
  paVar1 = &(this->Polarization).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->Polarization).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00224300;
  pcVar2 = (this->Polarization).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Polarization).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->Intensity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00224300;
  pcVar2 = (this->Intensity).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Intensity).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->WaveVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00224d00;
  pdVar3 = (this->WaveVector).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3,(long)(this->WaveVector).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar3);
  }
  (this->WaveVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00224300;
  pcVar2 = (this->WaveVector).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->WaveVector).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->PropagationDirection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00224d00;
  pdVar3 = (this->PropagationDirection).data_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3,(long)(this->PropagationDirection).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar3);
  }
  (this->PropagationDirection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00224300;
  pcVar2 = (this->PropagationDirection).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->PropagationDirection).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->Frequency).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00224300;
  pcVar2 = (this->Frequency).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Frequency).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->Wavelength).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00224300;
  pcVar2 = (this->Wavelength).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Wavelength).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseLight).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00224300;
  pcVar2 = (this->UseLight).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseLight).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__DataHolder_002243e8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).deprecatedKeywords_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).parameters_._M_t);
  return;
}

Assistant:

virtual ~LightParameters() = default;